

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity.c
# Opt level: O1

char * load_file(char *file,size_t *size,uint32_t *fileid,void *xdata,_Bool *is_static)

{
  _Bool _Var1;
  char *pcVar2;
  
  if (is_static != (_Bool *)0x0) {
    *is_static = false;
  }
  _Var1 = file_exists(file);
  if (_Var1) {
    pcVar2 = file_read(file,size);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

static const char *load_file (const char *file, size_t *size, uint32_t *fileid, void *xdata, bool *is_static) {
    (void) fileid, (void) xdata;

	// this callback is called each time an import statement is parsed
	// file arg represents what user wrote after the import keyword, for example:
	// import "file2"
	// import "file2.gravity"
	// import "../file2"
	// import "/full_path_to_file2"

	// it is callback's responsibility to resolve file path based on current working directory
	// or based on user defined search paths
	// and returns:
	// size of file in *size
	// fileid (if any) in *fileid
	// content of file as return value of the function

	// fileid will then be used each time an error is reported by the compiler
	// so it is responsibility of this function to map somewhere the association
	// between fileid and real file/path name

	// fileid is not used in this example
	// xdata not used here but it the xdata field set in the delegate
	// please note than in this simple example the imported file must be
	// in the same folder as the main input file

    if (is_static) *is_static = false;
	if (!file_exists(file)) return NULL;
	return file_read(file, size);
}